

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

void Image_Function::BitwiseOr
               (Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,uint32_t startX2,
               uint32_t startY2,Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t width,
               uint32_t height)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Image *pIVar4;
  byte bVar5;
  undefined4 in_register_00000014;
  uchar *puVar6;
  uchar *puVar7;
  ulong uVar8;
  undefined4 in_register_0000008c;
  uchar *puVar9;
  uchar *puVar10;
  uint local_a4;
  undefined8 local_a0;
  Image *local_98;
  undefined8 local_90;
  Image *local_88;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  local_a0 = CONCAT44(in_register_00000014,startY1);
  local_90 = CONCAT44(in_register_0000008c,startY2);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in1,startX1,startY1,in2,startX2,startY2,out,startXOut,startYOut,width,height);
  local_88 = in1;
  bVar5 = CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>(in1,in2,out);
  local_a4 = width * bVar5;
  local_98 = in2;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,in2);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_80,out);
  pIVar4 = local_88;
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (&local_a4,&height,local_88,&local_58,&local_80);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_80);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_58);
  uVar1 = pIVar4->_rowSize;
  uVar2 = out->_rowSize;
  uVar3 = local_98->_rowSize;
  puVar10 = pIVar4->_data + (ulong)(startX1 * bVar5) + (ulong)((int)local_a0 * uVar1);
  puVar6 = local_98->_data + (ulong)(startX2 * bVar5) + (ulong)((int)local_90 * uVar3);
  puVar9 = out->_data + (ulong)(startXOut * bVar5) + (ulong)(startYOut * uVar2);
  puVar7 = puVar9 + height * uVar2;
  for (; puVar9 != puVar7; puVar9 = puVar9 + uVar2) {
    for (uVar8 = 0; local_a4 != uVar8; uVar8 = uVar8 + 1) {
      puVar9[uVar8] = puVar6[uVar8] | puVar10[uVar8];
    }
    puVar10 = puVar10 + uVar1;
    puVar6 = puVar6 + uVar3;
  }
  return;
}

Assistant:

void BitwiseOr( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                    Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height )
    {
        ParameterValidation( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );

        const uint8_t colorCount  = CommonColorCount( in1, in2, out );
        width = width * colorCount;

        OptimiseRoi( width, height, in1, in2, out );

        const uint32_t rowSize1   = in1.rowSize();
        const uint32_t rowSize2   = in2.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * in1Y = in1.data() + startY1   * rowSize1   + startX1   * colorCount;
        const uint8_t * in2Y = in2.data() + startY2   * rowSize2   + startX2   * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, in1Y += rowSize1, in2Y += rowSize2 ) {
            const uint8_t * in1X = in1Y;
            const uint8_t * in2X = in2Y;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX, ++in1X, ++in2X )
                (*outX) = (*in1X) | (*in2X);
        }
    }